

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O2

bool_t botpHOTPStepV(char *otp,void *state)

{
  int iVar1;
  
  memCopy((void *)((long)state + 0x10),(void *)((long)state + 8),8);
  botpHOTPStepR((char *)((long)state + 0x38),state);
  iVar1 = strCmp((char *)((long)state + 0x38),otp);
  if (iVar1 != 0) {
    memCopy((void *)((long)state + 8),(void *)((long)state + 0x10),8);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

bool_t botpHOTPStepV(const char* otp, void* state)
{
	botp_hotp_st* st = (botp_hotp_st*)state;
	// pre
	ASSERT(strIsValid(otp));
	ASSERT(memIsDisjoint2(otp, strLen(otp) + 1, state, botpHOTP_keep()));
	// сохранить счетчик
	memCopy(st->ctr1, st->ctr, 8);
	// проверить пароль
	botpHOTPStepR(st->otp, state);
	if (strEq(st->otp, otp))
		return TRUE;
	// вернуться к первоначальному счетчику
	memCopy(st->ctr, st->ctr1, 8);
	return FALSE;
}